

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O3

exr_result_t save_v3f(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  exr_attr_v3f_t tmp;
  int32_t isz;
  char *local_20;
  undefined4 local_18;
  undefined4 local_14;
  
  local_18 = *(undefined4 *)&a->type_name;
  local_20 = a->name;
  local_14 = 0xc;
  eVar1 = (*ctxt->do_write)(ctxt,&local_14,4,&ctxt->output_file_offset);
  if (eVar1 == 0) {
    eVar1 = (*ctxt->do_write)(ctxt,&local_20,0xc,&ctxt->output_file_offset);
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_v3f (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t   rv;
    exr_attr_v3f_t tmp = *(a->v3f);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_v3f_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 3);
    return rv;
}